

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O2

void __thiscall HighsRandom::advance(HighsRandom *this)

{
  ulong uVar1;
  
  uVar1 = this->state >> 0xc ^ this->state;
  uVar1 = uVar1 << 0x19 ^ uVar1;
  this->state = uVar1 >> 0x1b ^ uVar1;
  return;
}

Assistant:

void advance() {
    // advance state with simple xorshift the outputs are produced by applying
    // strongly universal hash functions to the state so that the least
    // significant bits are as well distributed as the most significant bits.
    state ^= state >> 12;
    state ^= state << 25;
    state ^= state >> 27;
  }